

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestContext.cpp
# Opt level: O1

void __thiscall
tcu::TestContext::TestContext
          (TestContext *this,Platform *platform,Archive *rootArchive,TestLog *log,
          CommandLine *cmdLine,qpWatchDog *watchDog)

{
  this->m_platform = platform;
  this->m_rootArchive = rootArchive;
  this->m_log = log;
  this->m_cmdLine = cmdLine;
  this->m_watchDog = watchDog;
  this->m_testResult = QP_TEST_RESULT_LAST;
  (this->m_testResultDesc)._M_dataplus._M_p = (pointer)&(this->m_testResultDesc).field_2;
  (this->m_testResultDesc)._M_string_length = 0;
  (this->m_testResultDesc).field_2._M_local_buf[0] = '\0';
  this->m_terminateAfter = false;
  this->m_curArchive = rootArchive;
  return;
}

Assistant:

TestContext::TestContext (
	Platform&			platform,
	Archive&			rootArchive,
	TestLog&			log,
	const CommandLine&	cmdLine,
	qpWatchDog*			watchDog)
	: m_platform		(platform)
	, m_rootArchive		(rootArchive)
	, m_log				(log)
	, m_cmdLine			(cmdLine)
	, m_watchDog		(watchDog)
	, m_curArchive		(DE_NULL)
	, m_testResult		(QP_TEST_RESULT_LAST)
	, m_terminateAfter	(false)
{
	setCurrentArchive(m_rootArchive);
}